

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGaussPoint.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChGaussPoint::ChGaussPoint
          (ChGaussPoint *this,int number,ChVector<double> *coord,double weight)

{
  DenseStorage<double,__1,__1,__1,_1> *this_00;
  undefined4 in_register_00000034;
  
  *(double *)
   ((long)(this->Strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 0x20
   ) = 0.0;
  *(double *)
   ((long)(this->Strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 0x28
   ) = 0.0;
  (this->Stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->Stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->Stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  *(double *)
   ((long)(this->Stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 0x18
   ) = 0.0;
  *(double *)
   ((long)(this->Stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 0x20
   ) = 0.0;
  *(double *)
   ((long)(this->Stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 0x28
   ) = 0.0;
  (this->Strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->Strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 8) =
       0.0;
  *(double *)
   ((long)(this->Strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 0x10
   ) = 0.0;
  *(double *)
   ((long)(this->Strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 0x18
   ) = 0.0;
  *(double *)
   ((long)(this->Strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 0x20
   ) = 0.0;
  *(double *)
   ((long)(this->Strain).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 0x28
   ) = 0.0;
  (this->Stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
  *(double *)
   ((long)(this->Stress).super_ChVoightTensor<double>.super_ChVectorN<double,_6>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 8) =
       0.0;
  this->m_number = number;
  (this->m_local_coordinates).m_data[0] = coord->m_data[0];
  (this->m_local_coordinates).m_data[1] = coord->m_data[1];
  (this->m_local_coordinates).m_data[2] = coord->m_data[2];
  this->m_coordinates = (ChVector<double> *)0x0;
  this->m_weight = weight;
  this_00 = (DenseStorage<double,__1,__1,__1,_1> *)
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator_new
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)0x18,
                       CONCAT44(in_register_00000034,number));
  this_00->m_data = (double *)0x0;
  this_00->m_rows = 0;
  this_00->m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(this_00,1,1,1);
  this->MatrB = (ChMatrixDynamic<> *)this_00;
  return;
}

Assistant:

ChGaussPoint::ChGaussPoint(int number, ChVector<>* coord, double weight)
    : m_number(number), m_local_coordinates(*coord), m_weight(weight), m_coordinates(nullptr) {
    MatrB = new ChMatrixDynamic<>(1, 1);
}